

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_setup_connection(Curl_easy *data,connectdata *conn)

{
  FILEPROTO *pFVar1;
  smb_request *req;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pFVar1 = (FILEPROTO *)(*Curl_ccalloc)(1,0x18);
  (data->req).p.file = pFVar1;
  if (pFVar1 == (FILEPROTO *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    data_local._4_4_ = smb_parse_url_path(data,conn);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_setup_connection(struct Curl_easy *data,
                                     struct connectdata *conn)
{
  struct smb_request *req;

  /* Initialize the request state */
  data->req.p.smb = req = calloc(1, sizeof(struct smb_request));
  if(!req)
    return CURLE_OUT_OF_MEMORY;

  /* Parse the URL path */
  return smb_parse_url_path(data, conn);
}